

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

string * __thiscall Catch::AssertionResult::getExpression_abi_cxx11_(AssertionResult *this)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  char *in_stack_00000028;
  
  bVar1 = isFalseTest(*(int *)(in_RSI + 0x68));
  if (bVar1) {
    std::operator+(in_stack_00000028,in_stack_00000020);
  }
  else {
    std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x48));
  }
  return in_RDI;
}

Assistant:

std::string AssertionResult::getExpression() const {
        if( isFalseTest( m_info.resultDisposition ) )
            return "!" + m_info.capturedExpression;
        else
            return m_info.capturedExpression;
    }